

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_ParmParse.cpp
# Opt level: O2

int __thiscall amrex::ParmParse::countname(ParmParse *this,string *name)

{
  _List_node_base *p_Var1;
  bool bVar2;
  int iVar3;
  _List_node_base *p_Var4;
  string local_50;
  
  p_Var1 = (_List_node_base *)this->m_table;
  iVar3 = 0;
  p_Var4 = p_Var1;
  while (p_Var4 = (((_List_base<amrex::ParmParse::PP_entry,_std::allocator<amrex::ParmParse::PP_entry>_>
                     *)&p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var4 != p_Var1) {
    prefixedName(&local_50,this,name);
    bVar2 = anon_unknown_12::ppfound(&local_50,(PP_entry *)(p_Var4 + 1),false);
    std::__cxx11::string::~string((string *)&local_50);
    iVar3 = iVar3 + (uint)bVar2;
  }
  return iVar3;
}

Assistant:

int
ParmParse::countname (const std::string& name) const
{
    int cnt = 0;
    for ( const_list_iterator li = m_table.begin(), End = m_table.end(); li != End; ++li )
    {
        if ( ppfound(prefixedName(name), *li, false) )
        {
            cnt++;
        }
    }
    return cnt;
}